

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O3

void __thiscall
mjs::test_spec_runner::check_test_spec_done(test_spec_runner *this,uint32_t check_pos)

{
  value *l;
  completion_type cVar1;
  uint uVar2;
  size_t sVar3;
  pointer ptVar4;
  element_type *peVar5;
  bool bVar6;
  wostream *pwVar7;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar8;
  value *v;
  value *v_00;
  value *v_01;
  wostringstream oss;
  wstring local_1d8;
  wstring local_1b8;
  wostringstream local_198 [376];
  
  sVar3 = this->index_;
  ptVar4 = (this->specs_->super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((sVar3 != ((long)(this->specs_->
                       super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)ptVar4 >> 3) * -0x71c71c71c71c71c7)
     && (ptVar4[sVar3].position < check_pos)) {
    ptVar4 = ptVar4 + sVar3;
    cVar1 = (this->last_result_).type;
    if ((cVar1 != normal) && (cVar1 != return_)) {
      std::__cxx11::wostringstream::wostringstream(local_198);
      peVar5 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         ((wostream *)local_198,(peVar5->filename_)._M_dataplus._M_p,
                          (peVar5->filename_)._M_string_length);
      pwVar7 = std::operator<<(pwVar7," failed: ");
      pwVar7 = mjs::operator<<(pwVar7,&(this->last_result_).type);
      pwVar7 = std::operator<<(pwVar7," ");
      debug_string_abi_cxx11_(&local_1d8,(mjs *)&(this->last_result_).result,v_01);
      pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      pwVar7 = std::operator<<(pwVar7," at ");
      pbVar8 = mjs::operator<<(pwVar7,&ptVar4->extend);
      pwVar7 = std::operator<<(pbVar8,"\n");
      uVar2 = (ptVar4->extend).start;
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar7,(((ptVar4->extend).file.
                          super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_)._M_dataplus._M_p + uVar2,(ulong)((ptVar4->extend).end - uVar2));
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity * 4 + 4);
      }
      std::__cxx11::wstringbuf::str();
      local_1b8._M_dataplus._M_p = (pointer)local_1d8._M_string_length;
      local_1b8._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
      throw_runtime_error((wstring_view *)&local_1b8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                          ,0xd3);
    }
    l = &(this->last_result_).result;
    bVar6 = operator==(l,&ptVar4->expected);
    if (!bVar6) {
      std::__cxx11::wostringstream::wostringstream(local_198);
      pwVar7 = std::operator<<((wostream *)local_198,"Expecting\n");
      debug_string_abi_cxx11_
                (&local_1d8,
                 (mjs *)&(this->specs_->
                         super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>).
                         _M_impl.super__Vector_impl_data._M_start[this->index_].expected,v);
      pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      pwVar7 = std::operator<<(pwVar7,"\ngot\n");
      debug_string_abi_cxx11_(&local_1b8,(mjs *)l,v_00);
      pwVar7 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar7,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
      pwVar7 = std::operator<<(pwVar7,"\nat ");
      pbVar8 = mjs::operator<<(pwVar7,&ptVar4->extend);
      pwVar7 = std::operator<<(pbVar8,"\n");
      uVar2 = (ptVar4->extend).start;
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar7,(((ptVar4->extend).file.
                          super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_)._M_dataplus._M_p + uVar2,(ulong)((ptVar4->extend).end - uVar2));
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity * 4 + 4);
      }
      std::__cxx11::wstringbuf::str();
      local_1b8._M_dataplus._M_p = (pointer)local_1d8._M_string_length;
      local_1b8._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
      throw_runtime_error((wstring_view *)&local_1b8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                          ,0xd8);
    }
    this->index_ = this->index_ + 1;
  }
  return;
}

Assistant:

void check_test_spec_done(uint32_t check_pos) {
        if (index_ == specs_.size()) {
            return;
        }
        const auto& s = specs_[index_];

        if (check_pos > s.position) {
#ifdef TEST_SPEC_DEBUG
            std::wcout << pos_w << check_pos << ": Checking pos " << pos_w << s.position << " at " << s.extend << " expecting " << debug_string(s.expected) << "\n";
#endif
            if (last_result_ && last_result_.type != completion_type::return_) { // Allow return for the sake of function expressions
                std::wostringstream oss;
                oss << source_->filename() << " failed: " << last_result_.type << " " << debug_string(last_result_.result) << " at " << s.extend << "\n" << s.extend.source_view();
                THROW_RUNTIME_ERROR(oss.str());
            }
            if (last_result_.result != specs_[index_].expected) {
                std::wostringstream oss;
                oss << "Expecting\n" << debug_string(specs_[index_].expected) << "\ngot\n" << debug_string(last_result_.result) << "\nat " << s.extend << "\n" << s.extend.source_view();
                THROW_RUNTIME_ERROR(oss.str());
            }
            ++index_;
        }
    }